

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

void bssl::ssl_crypto_x509_session_clear(SSL_SESSION *session)

{
  X509_free((X509 *)session->x509_peer);
  session->x509_peer = (X509 *)0x0;
  OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)session->x509_chain,sk_X509_call_free_func,X509_free);
  session->x509_chain = (stack_st_X509 *)0x0;
  OPENSSL_sk_pop_free_ex
            ((OPENSSL_STACK *)session->x509_chain_without_leaf,sk_X509_call_free_func,X509_free);
  session->x509_chain_without_leaf = (stack_st_X509 *)0x0;
  return;
}

Assistant:

static void ssl_crypto_x509_session_clear(SSL_SESSION *session) {
  X509_free(session->x509_peer);
  session->x509_peer = nullptr;
  sk_X509_pop_free(session->x509_chain, X509_free);
  session->x509_chain = nullptr;
  sk_X509_pop_free(session->x509_chain_without_leaf, X509_free);
  session->x509_chain_without_leaf = nullptr;
}